

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<kj::String,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,String *params,char (*params_1) [2])

{
  StringTree local_50;
  ArrayPtr<const_char> local_18;
  
  local_50.text.content.size_ = *(size_t *)(this + 8);
  local_50.size_ = 0;
  if (local_50.text.content.size_ != 0) {
    local_50.size_ = local_50.text.content.size_ - 1;
  }
  local_50.text.content.ptr = *(char **)this;
  local_50.text.content.disposer = *(ArrayDisposer **)(this + 0x10);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_50.branches.ptr = (Branch *)0x0;
  local_50.branches.size_ = 0;
  local_50.branches.disposer = (ArrayDisposer *)0x0;
  local_18 = toCharSequence<char_const(&)[2]>((char (*) [2])params);
  StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,&local_50,(StringTree *)&local_18,&local_18);
  StringTree::~StringTree(&local_50);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}